

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

ByteData256 * __thiscall
cfd::core::ConfidentialTransaction::GetElementsSignatureHash
          (ByteData256 *__return_storage_ptr__,ConfidentialTransaction *this,uint32_t txin_index,
          ByteData *script_data,SigHashType *sighash_type,ConfidentialValue *value,
          WitnessVersion version)

{
  wally_tx *tx;
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t sighash;
  CfdException *pCVar4;
  int ret;
  undefined1 local_d0 [32];
  wally_tx *tx_pointer;
  uint32_t local_a4;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  bVar1 = ByteData::IsEmpty(script_data);
  if (bVar1) {
    local_d0._0_8_ = "cfdcore_elements_transaction.cpp";
    local_d0._8_4_ = 0xc12;
    local_d0._16_8_ = "GetElementsSignatureHash";
    logger::warn<>((CfdSourceLocation *)local_d0,"empty script");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_d0,"Failed to GetSignatureHash. empty script.",(allocator *)&buffer);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_d0);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&buffer,0x20,(allocator_type *)local_d0);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,script_data)
  ;
  tx_pointer = (wally_tx *)0x0;
  uVar2 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[7])(this);
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xd])
            (local_d0,this,(ulong)(uVar2 & 0xff));
  local_a4 = txin_index;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,
                     (ByteData *)local_d0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
  uVar3 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[9])(this);
  ret = wally_tx_from_bytes(local_60._M_impl.super__Vector_impl_data._M_start,
                            (long)local_60._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_60._M_impl.super__Vector_impl_data._M_start,uVar3,
                            &tx_pointer);
  if ((ret == 0) && (tx_pointer != (wally_tx *)0x0)) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,
               &(value->data_).data_);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0,
                       (ByteData *)local_d0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
    if (version == kVersionNone) {
      uVar3 = 0;
    }
    else {
      uVar2 = (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[9])(this);
      uVar3 = uVar2 & 1;
    }
    tx = tx_pointer;
    sighash = SigHashType::GetSigHashFlag(sighash_type);
    ret = wally_tx_get_elements_signature_hash
                    (tx,(ulong)local_a4,local_48._M_impl.super__Vector_impl_data._M_start,
                     (long)local_48._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_48._M_impl.super__Vector_impl_data._M_start,
                     local_a0._M_impl.super__Vector_impl_data._M_start,
                     (long)local_a0._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_a0._M_impl.super__Vector_impl_data._M_start,sighash,uVar3,
                     buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start);
    wally_tx_free(tx_pointer);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a0);
    if (ret == 0) {
      ByteData256::ByteData256(__return_storage_ptr__,&buffer);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return __return_storage_ptr__;
    }
    local_d0._0_8_ = "cfdcore_elements_transaction.cpp";
    local_d0._8_4_ = 0xc3b;
    local_d0._16_8_ = "GetElementsSignatureHash";
    logger::warn<int&>((CfdSourceLocation *)local_d0,"wally_tx_get_elements_signature_hash NG[{}] ",
                       &ret);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_d0,"SignatureHash generate error.",(allocator *)&local_a0);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_d0);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_d0._0_8_ = "cfdcore_elements_transaction.cpp";
  local_d0._8_4_ = 0xc21;
  local_d0._16_8_ = "GetElementsSignatureHash";
  logger::warn<int&>((CfdSourceLocation *)local_d0,"wally_tx_from_bytes NG[{}] ",&ret);
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_d0,"transaction data invalid.",(allocator *)&local_a0);
  CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_d0);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData256 ConfidentialTransaction::GetElementsSignatureHash(
    uint32_t txin_index, const ByteData &script_data, SigHashType sighash_type,
    const ConfidentialValue &value, WitnessVersion version) const {
  if (script_data.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "empty script");
    throw CfdException(
        kCfdIllegalArgumentError, "Failed to GetSignatureHash. empty script.");
  }
  std::vector<uint8_t> buffer(SHA256_LEN);
  const std::vector<uint8_t> &bytes = script_data.GetBytes();
  struct wally_tx *tx_pointer = NULL;
  int ret;

  // Change AbstractTransaction to wally_tx
  const std::vector<uint8_t> &tx_bytedata =
      GetByteData(HasWitness()).GetBytes();
  ret = wally_tx_from_bytes(
      tx_bytedata.data(), tx_bytedata.size(), GetWallyFlag(), &tx_pointer);
  if (ret != WALLY_OK || tx_pointer == NULL) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_bytes NG[{}] ", ret);
    throw CfdException(kCfdIllegalArgumentError, "transaction data invalid.");
  }

  // Calculate signature hash
  try {
    const std::vector<uint8_t> &value_data = value.GetData().GetBytes();
    uint32_t tx_flag = 0;
    if (version != WitnessVersion::kVersionNone) {
      tx_flag = GetWallyFlag() & WALLY_TX_FLAG_USE_WITNESS;
    }
    ret = wally_tx_get_elements_signature_hash(
        tx_pointer, txin_index, bytes.data(), bytes.size(), value_data.data(),
        value_data.size(), sighash_type.GetSigHashFlag(), tx_flag,
        buffer.data(), buffer.size());
    wally_tx_free(tx_pointer);
  } catch (...) {
    wally_tx_free(tx_pointer);
    warn(
        CFD_LOG_SOURCE, "wally_tx_get_elements_signature_hash exception[{}] ",
        ret);
    throw CfdException(
        kCfdIllegalArgumentError, "SignatureHash generate error.");
  }

  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_elements_signature_hash NG[{}] ", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "SignatureHash generate error.");
  }
  return ByteData256(buffer);
}